

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameWithClusterInfo.cpp
# Opt level: O0

string * __thiscall
BayesianGameWithClusterInfo::SoftPrint_abi_cxx11_(BayesianGameWithClusterInfo *this)

{
  JointBeliefInterface *pJVar1;
  bool bVar2;
  uint uVar3;
  ostream *poVar4;
  void *pvVar5;
  type pJVar6;
  const_reference pvVar7;
  reference ppJVar8;
  ulong uVar9;
  const_reference ppvVar10;
  ulong uVar11;
  long in_RSI;
  string *in_RDI;
  const_iterator it_2;
  Index i_2;
  TypeClusterList *tl_1;
  Index agI_1;
  const_iterator it_1;
  Index i_1;
  const_iterator it;
  Index i;
  TypeClusterList *tl;
  Index agI;
  stringstream ss;
  vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *in_stack_fffffffffffffbc8
  ;
  shared_ptr<const_BayesianGameWithClusterInfo> *in_stack_fffffffffffffbd0;
  __normal_iterator<TypeCluster_*const_*,_std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_>
  *in_stack_fffffffffffffbd8;
  undefined8 in_stack_fffffffffffffc20;
  BayesianGameBase *in_stack_fffffffffffffc28;
  string local_2c8 [32];
  TypeCluster **local_2a8;
  TypeCluster **local_2a0;
  __normal_iterator<TypeCluster_*const_*,_std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_>
  local_298;
  uint local_28c;
  value_type local_288;
  uint local_27c;
  JointBeliefInterface **local_278;
  string local_270 [32];
  string local_250 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffdb8;
  TypeCluster *in_stack_fffffffffffffdc8;
  __normal_iterator<JointBeliefInterface_*const_*,_std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>
  local_228;
  uint local_21c;
  string local_218 [32];
  TypeCluster **local_1f8;
  string local_1f0 [8];
  BayesianGameForDecPOMDPStage *in_stack_fffffffffffffe18;
  __normal_iterator<TypeCluster_*const_*,_std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_>
  local_1c0;
  uint local_1b4;
  value_type local_1b0;
  uint local_1a8;
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar4 = std::operator<<(local_188,"Previous joint policy:");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  bVar2 = boost::operator!=((shared_ptr<const_JointPolicyDiscretePure> *)in_stack_fffffffffffffbd0,
                            in_stack_fffffffffffffbc8);
  if ((bVar2) &&
     (bVar2 = boost::operator!=(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8), bVar2)) {
    for (local_1a8 = 0; uVar11 = (ulong)local_1a8,
        uVar9 = (**(code **)(*(long *)(in_RSI + 0x20) + 0x18))(in_RSI + 0x20), uVar11 < uVar9;
        local_1a8 = local_1a8 + 1) {
      poVar4 = std::operator<<(local_188,"agI=");
      pvVar5 = (void *)std::ostream::operator<<(poVar4,local_1a8);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
      boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator->
                ((shared_ptr<const_BayesianGameWithClusterInfo> *)(in_RSI + 0x150));
      ppvVar10 = std::
                 vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                 ::at((vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                       *)in_stack_fffffffffffffbd0,(size_type)in_stack_fffffffffffffbc8);
      local_1b0 = *ppvVar10;
      local_1b4 = 0;
      std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>::begin
                ((vector<TypeCluster_*,_std::allocator<TypeCluster_*>_> *)in_stack_fffffffffffffbc8)
      ;
      __gnu_cxx::
      __normal_iterator<TypeCluster*const*,std::vector<TypeCluster*,std::allocator<TypeCluster*>>>::
      __normal_iterator<TypeCluster**>
                ((__normal_iterator<TypeCluster_*const_*,_std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_>
                  *)in_stack_fffffffffffffbd0,
                 (__normal_iterator<TypeCluster_**,_std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_>
                  *)in_stack_fffffffffffffbc8);
      while( true ) {
        std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>::end
                  ((vector<TypeCluster_*,_std::allocator<TypeCluster_*>_> *)
                   in_stack_fffffffffffffbc8);
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<TypeCluster_*const_*,_std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_>
                            *)in_stack_fffffffffffffbd0,
                           (__normal_iterator<TypeCluster_**,_std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_>
                            *)in_stack_fffffffffffffbc8);
        if (!bVar2) break;
        poVar4 = std::operator<<(local_188,"tI ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_1b4);
        poVar4 = std::operator<<(poVar4," - ");
        __gnu_cxx::
        __normal_iterator<TypeCluster_*const_*,_std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_>
        ::operator*(&local_1c0);
        TypeCluster::SoftPrint_abi_cxx11_(in_stack_fffffffffffffdc8);
        poVar4 = std::operator<<(poVar4,local_1f0);
        poVar4 = std::operator<<(poVar4," Action: ");
        pJVar6 = boost::shared_ptr<const_JointPolicyDiscretePure>::operator->
                           ((shared_ptr<const_JointPolicyDiscretePure> *)(in_RSI + 0x170));
        uVar3 = (*(pJVar6->super_JointPolicyDiscrete).super_JointPolicy._vptr_JointPolicy[0x13])
                          (pJVar6,(ulong)local_1a8,(ulong)local_1b4);
        pvVar5 = (void *)std::ostream::operator<<(poVar4,uVar3);
        std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_1f0);
        local_1f8 = (TypeCluster **)
                    __gnu_cxx::
                    __normal_iterator<TypeCluster_*const_*,_std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_>
                    ::operator++(in_stack_fffffffffffffbd8,
                                 (int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
        local_1b4 = local_1b4 + 1;
      }
    }
    poVar4 = std::operator<<(local_188,"that lead to the following BG:");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar4 = std::operator<<(local_188,"There is no previous BG or BG-policy");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  BayesianGameForDecPOMDPStage::SoftPrint_abi_cxx11_(in_stack_fffffffffffffe18);
  std::operator<<(local_188,local_218);
  std::__cxx11::string::~string(local_218);
  poVar4 = std::operator<<(local_188,"This BG is clustered/clusterable.");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(local_188,"Joint beliefs assoc. with each joint type:");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  local_21c = 0;
  local_228._M_current =
       (JointBeliefInterface **)
       std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::begin
                 (in_stack_fffffffffffffbc8);
  while( true ) {
    std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::end
              (in_stack_fffffffffffffbc8);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<JointBeliefInterface_*const_*,_std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>
                        *)in_stack_fffffffffffffbd0,
                       (__normal_iterator<JointBeliefInterface_*const_*,_std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>
                        *)in_stack_fffffffffffffbc8);
    if (!bVar2) break;
    poVar4 = std::operator<<(local_188,"jtI=");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_21c);
    poVar4 = std::operator<<(poVar4,"=");
    BayesianGameBase::JointToIndividualTypeIndices
              (in_stack_fffffffffffffc28,(Index)((ulong)in_stack_fffffffffffffc20 >> 0x20));
    PrintTools::SoftPrintVector<unsigned_int>(in_stack_fffffffffffffdb8);
    poVar4 = std::operator<<(poVar4,local_250);
    poVar4 = std::operator<<(poVar4,", repres. jaohI=");
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        in_stack_fffffffffffffbd0,(size_type)in_stack_fffffffffffffbc8);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar7);
    poVar4 = std::operator<<(poVar4,", jb=");
    ppJVar8 = __gnu_cxx::
              __normal_iterator<JointBeliefInterface_*const_*,_std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>
              ::operator*(&local_228);
    pJVar1 = *ppJVar8;
    (**(code **)(*(long *)((long)&pJVar1->field_0x0 + *(long *)((long)*pJVar1 + -0xb8)) + 0x60))
              (local_270,(long)&pJVar1->field_0x0 + *(long *)((long)*pJVar1 + -0xb8));
    in_stack_fffffffffffffc28 = (BayesianGameBase *)std::operator<<(poVar4,local_270);
    std::ostream::operator<<(in_stack_fffffffffffffc28,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_270);
    std::__cxx11::string::~string(local_250);
    local_278 = (JointBeliefInterface **)
                __gnu_cxx::
                __normal_iterator<JointBeliefInterface_*const_*,_std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>
                ::operator++((__normal_iterator<JointBeliefInterface_*const_*,_std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>
                              *)in_stack_fffffffffffffbd8,
                             (int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
    local_21c = local_21c + 1;
  }
  poVar4 = std::operator<<(local_188,"Type lists of agents:");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  for (local_27c = 0; uVar11 = (ulong)local_27c,
      uVar9 = (**(code **)(*(long *)(in_RSI + 0x20) + 0x18))(in_RSI + 0x20), uVar11 < uVar9;
      local_27c = local_27c + 1) {
    poVar4 = std::operator<<(local_188,"agI=");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_27c);
    poVar4 = std::operator<<(poVar4,", types:");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    ppvVar10 = std::
               vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
               ::at((vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                     *)in_stack_fffffffffffffbd0,(size_type)in_stack_fffffffffffffbc8);
    local_288 = *ppvVar10;
    local_28c = 0;
    local_2a0 = (TypeCluster **)
                std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>::begin
                          ((vector<TypeCluster_*,_std::allocator<TypeCluster_*>_> *)
                           in_stack_fffffffffffffbc8);
    __gnu_cxx::
    __normal_iterator<TypeCluster*const*,std::vector<TypeCluster*,std::allocator<TypeCluster*>>>::
    __normal_iterator<TypeCluster**>
              ((__normal_iterator<TypeCluster_*const_*,_std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_>
                *)in_stack_fffffffffffffbd0,
               (__normal_iterator<TypeCluster_**,_std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_>
                *)in_stack_fffffffffffffbc8);
    while( true ) {
      local_2a8 = (TypeCluster **)
                  std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>::end
                            ((vector<TypeCluster_*,_std::allocator<TypeCluster_*>_> *)
                             in_stack_fffffffffffffbc8);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<TypeCluster_*const_*,_std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_>
                          *)in_stack_fffffffffffffbd0,
                         (__normal_iterator<TypeCluster_**,_std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_>
                          *)in_stack_fffffffffffffbc8);
      if (!bVar2) break;
      poVar4 = std::operator<<(local_188,"tI ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_28c);
      poVar4 = std::operator<<(poVar4," - ");
      __gnu_cxx::
      __normal_iterator<TypeCluster_*const_*,_std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_>
      ::operator*(&local_298);
      TypeCluster::SoftPrint_abi_cxx11_(in_stack_fffffffffffffdc8);
      in_stack_fffffffffffffbd0 =
           (shared_ptr<const_BayesianGameWithClusterInfo> *)std::operator<<(poVar4,local_2c8);
      std::ostream::operator<<(in_stack_fffffffffffffbd0,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_2c8);
      __gnu_cxx::
      __normal_iterator<TypeCluster_*const_*,_std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_>
      ::operator++((__normal_iterator<TypeCluster_*const_*,_std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_>
                    *)poVar4,(int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
      local_28c = local_28c + 1;
    }
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

string BayesianGameWithClusterInfo::SoftPrint() const
{
    stringstream ss;
    ss << "Previous joint policy:"<<endl;
    if(_m_pBGJPol != 0 && _m_pBG != 0)
    {
        for(Index agI=0; agI < GetNrAgents(); agI++)
        {
            ss << "agI=" << agI <<endl;
            TypeClusterList* tl = _m_pBG->_m_typeLists.at(agI);
            {
                Index i=0;
                for(TypeClusterList::const_iterator it = tl->begin();
                        it != tl->end(); it++, i++)
                {
                    ss << "tI "<< i << " - " << (*it)->SoftPrint() 
                        << " Action: " << _m_pBGJPol->GetActionIndex(agI, i)
                        << endl;

                }
            }
        }
        ss << "that lead to the following BG:"<<endl;
    }
    else
        ss << "There is no previous BG or BG-policy"<<endl;



    ss << BayesianGameForDecPOMDPStage::SoftPrint(); 
    ss << "This BG is clustered/clusterable."<<endl;
    ss << "Joint beliefs assoc. with each joint type:"<<endl;
    {
        Index i=0;
        for(vector< JointBeliefInterface* >::const_iterator it=_m_JBs.begin(); 
                it != _m_JBs.end(); it++, i++)
        {
            ss << "jtI="<<i
                << "=" << PrintTools::SoftPrintVector(
                        JointToIndividualTypeIndices(i)
                        )
                << ", repres. jaohI="<< _m_jaohReps.at(i)
            //GetPUDecPOMDPDiscrete()->GetJointActionObservationHistoryTree(_m_jaohReps.at(i))->
                    //GetJointActionObservationHistory()->
                    //SoftPrintJointIndicesconst()
                <<", jb="<< (*it)->SoftPrint() 
            << endl;
        }
    }
    ss << "Type lists of agents:"<<endl;
    for(Index agI=0; agI < GetNrAgents(); agI++)
    {
        ss << "agI=" << agI << ", types:"<<endl;
        TypeClusterList* tl = _m_typeLists.at(agI);
        {
            Index i=0;
            for(TypeClusterList::const_iterator it = tl->begin();
                    it != tl->end(); it++, i++)
            {
                ss << "tI "<< i << " - " << (*it)->SoftPrint() << endl;
            }
        }
    }

    return(ss.str());
}